

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_cmov(fe_loose *f,fe_loose *g,fe_limb_t b)

{
  fe_limb_t x;
  uint i;
  fe_limb_t b_local;
  fe_loose *g_local;
  fe_loose *f_local;
  
  for (x._4_4_ = 0; x._4_4_ < 5; x._4_4_ = x._4_4_ + 1) {
    f->v[x._4_4_] = -b & (f->v[x._4_4_] ^ g->v[x._4_4_]) ^ f->v[x._4_4_];
  }
  return;
}

Assistant:

static void fe_cmov(fe_loose *f, const fe_loose *g, fe_limb_t b) {
  // Silence an unused function warning. |fiat_25519_selectznz| isn't quite the
  // calling convention the rest of this code wants, so implement it by hand.
  //
  // TODO(davidben): Switch to fiat's calling convention, or ask fiat to emit a
  // different one.

  b = 0 - b;
  for (unsigned i = 0; i < FE_NUM_LIMBS; i++) {
    fe_limb_t x = f->v[i] ^ g->v[i];
    x &= b;
    f->v[i] ^= x;
  }
}